

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O2

bool __thiscall
MADPComponentDiscreteStates::SetInitialized(MADPComponentDiscreteStates *this,bool b)

{
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ostream *poVar4;
  size_t sVar5;
  E *this_00;
  double *pdVar6;
  double *pdVar7;
  undefined7 in_register_00000031;
  double *pdVar8;
  byte bVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  if ((int)CONCAT71(in_register_00000031,b) != 0) {
    sVar5 = this->_m_nrStates;
    if (sVar5 == 0) {
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,"MADPComponentDiscreteStates::SetInitialized problem has 0 states");
    }
    else {
      bVar9 = 1;
      auVar10 = ZEXT864(0) << 0x40;
      pdVar6 = (this->_m_initialStateDistribution->super_SDV).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      pdVar7 = (this->_m_initialStateDistribution->super_SDV).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (pdVar8 = pdVar7; pdVar8 != pdVar6; pdVar8 = pdVar8 + 1) {
        dVar1 = *pdVar8;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dVar1;
        uVar2 = vcmppd_avx512vl(ZEXT816(0x3ff0000000000000),auVar13,5);
        auVar10 = ZEXT864((ulong)(auVar10._0_8_ + dVar1));
        uVar3 = vcmppd_avx512vl(auVar13,ZEXT816(0) << 0x40,5);
        bVar9 = (byte)uVar2 & 3 & (byte)uVar3 & bVar9 & !NAN(dVar1);
      }
      auVar12._8_8_ = 0x7fffffffffffffff;
      auVar12._0_8_ = 0x7fffffffffffffff;
      auVar13 = vandpd_avx(auVar10._0_16_,auVar12);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = auVar10._0_8_ + -1.0;
      auVar11 = vandpd_avx(auVar11,auVar12);
      if (1e-12 <= auVar13._0_8_) {
        bVar9 = auVar11._0_8_ <= 1e-12 & bVar9;
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "Warning, initial state distribution was not set, assuming uniform..."
                                );
        std::endl<char,std::char_traits<char>>(poVar4);
        SetUniformISD(this);
        sVar5 = this->_m_nrStates;
        bVar9 = 1;
        pdVar7 = (this->_m_initialStateDistribution->super_SDV).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar6 = (this->_m_initialStateDistribution->super_SDV).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish;
      }
      if (((long)pdVar6 - (long)pdVar7 >> 3 == sVar5) && (bVar9 != 0)) goto LAB_004b9a80;
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,
           "MADPComponentDiscreteStates::SetInitialized initial state distribution is not a valid probability distribution"
          );
    }
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
LAB_004b9a80:
  this->_m_initialized = b;
  return b;
}

Assistant:

bool MADPComponentDiscreteStates::SetInitialized(bool b)
{
    if(b)
    {
        if(_m_nrStates==0)
            throw(E("MADPComponentDiscreteStates::SetInitialized problem has 0 states"));

        // alike to Belief::SanityCheck()

        bool validISD=true;

        // check for negative and entries>1
        double sum=0;
        for(vector<double>::const_iterator it=
                _m_initialStateDistribution->begin();
            it!=_m_initialStateDistribution->end(); ++it)
        {
            if(*it<0)
                validISD=false;
            if(*it>1)
                validISD=false;
            if(std::isnan(*it))
                validISD=false;
            sum+=*it;
        }

        // check if sums to 1
        if(abs(sum-1)>PROB_PRECISION)
            validISD=false;

        // but if it sums to 0, this means the ISD simply has not been set.
        // in this case, we set to uniform:
        if(abs(sum) < PROB_PRECISION)
        {
            cerr << "Warning, initial state distribution was not set, assuming uniform..." << endl;
            this->SetUniformISD();
            validISD = true;
        }

        // check whether the size is correct
        if(_m_initialStateDistribution->size()!=_m_nrStates)
            validISD=false;
        
        if(!validISD)
            throw(E("MADPComponentDiscreteStates::SetInitialized initial state distribution is not a valid probability distribution"));
    }

    _m_initialized = b;
    return(b);
}